

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_scene.cpp
# Opt level: O1

void __thiscall
FGLInterface::Precache
          (FGLInterface *this,BYTE *texhitlist,
          TMap<PClassActor_*,_bool,_THashTraits<PClassActor_*>,_TValueTraits<bool>_> *actorhitlist)

{
  size_t __n;
  byte bVar1;
  PClassActor *ti;
  FModel *pFVar2;
  FModelVertexBuffer *pFVar3;
  SpriteHits *translations;
  bool bVar4;
  Node *pNVar5;
  FModel **ppFVar6;
  int iVar7;
  hash_t hVar8;
  uint uVar9;
  ulong *puVar10;
  void *__s;
  void *__s_00;
  FSpriteModelFrame *pFVar11;
  long lVar12;
  FMaterial *pFVar13;
  long lVar14;
  IPair *pIVar15;
  ulong uVar16;
  ulong uVar17;
  FTextureManager *pFVar18;
  TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_> *pTVar19;
  uint uVar20;
  FTexture *pFVar21;
  int i_1;
  long lVar22;
  TMap<PClassActor_*,_bool,_THashTraits<PClassActor_*>,_TValueTraits<bool>_> *pTVar23;
  double dVar24;
  PrecacheProgress precacheProgress;
  timespec ts;
  undefined1 local_64 [8];
  bool local_5c;
  TMap<PClassActor_*,_bool,_THashTraits<PClassActor_*>,_TValueTraits<bool>_> *local_58;
  ulong *local_50;
  FTextureManager *local_48;
  timespec local_40;
  
  uVar17 = (ulong)sprites.Count;
  puVar10 = (ulong *)operator_new__(uVar17 * 0x18 + 8);
  *puVar10 = uVar17;
  if (uVar17 != 0) {
    lVar22 = 0;
    do {
      *(undefined4 *)((long)puVar10 + lVar22 + 0x1c) = 0;
      TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_>::SetNodeVector
                ((TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_> *)
                 ((long)puVar10 + lVar22 + 8),1);
      lVar22 = lVar22 + 0x18;
    } while (uVar17 * 0x18 != lVar22);
  }
  __n = (long)(int)TexMan.Textures.Count * 8;
  uVar17 = 0xffffffffffffffff;
  if (-1 < (long)(int)TexMan.Textures.Count) {
    uVar17 = __n;
  }
  local_58 = actorhitlist;
  local_50 = puVar10;
  __s = operator_new__(uVar17);
  uVar17 = (ulong)Models.super_TArray<FModel_*,_FModel_*>.Count;
  __s_00 = operator_new__(uVar17);
  memset(__s_00,0,uVar17);
  memset(__s,0,__n);
  if (0 < (int)TexMan.Textures.Count) {
    lVar22 = 0;
    do {
      if (((texhitlist[lVar22] & 5) != 0) &&
         (pFVar21 = TexMan.Textures.Array[lVar22].Texture,
         ((pFVar21->gl_info).field_0x4c & 0x10) != 0)) {
        lVar14 = 0;
        do {
          pFVar13 = pFVar21[1].gl_info.Material[lVar14 + -9];
          if (pFVar13 != (FMaterial *)0x0) {
            iVar7._0_2_ = pFVar13->mRenderWidth;
            iVar7._2_2_ = pFVar13->mRenderHeight;
            texhitlist[iVar7] = texhitlist[iVar7] | 2;
          }
          lVar14 = lVar14 + 1;
        } while (lVar14 != 6);
      }
      lVar22 = lVar22 + 1;
    } while (lVar22 < (int)TexMan.Textures.Count);
  }
  uVar20 = 0;
  pFVar18 = &TexMan;
  pTVar23 = local_58;
  do {
    uVar9 = pTVar23->Size;
    if (uVar20 < uVar9) {
      pNVar5 = pTVar23->Nodes + uVar20;
      do {
        pIVar15 = &pNVar5->Pair;
        uVar20 = uVar20 + 1;
        if (*(long *)((long)(pIVar15 + -1) + 8) != 1) {
          bVar4 = true;
          pFVar18 = (FTextureManager *)pIVar15;
          goto LAB_0044cbf3;
        }
        pNVar5 = (Node *)(pIVar15 + 1);
      } while (uVar20 != uVar9);
      bVar4 = false;
      uVar20 = uVar9;
    }
    else {
      bVar4 = false;
    }
LAB_0044cbf3:
    if (!bVar4) {
      if (-1 < (int)(sprites.Count - 1)) {
        uVar17 = (ulong)(sprites.Count - 1);
        do {
          hVar8 = TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_>::CountUsed
                            ((TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_> *)
                             (puVar10 + uVar17 * 3 + 1));
          if ((hVar8 != 0) && (bVar1 = sprites.Array[uVar17].numframes, (ulong)bVar1 != 0)) {
            lVar22 = (long)&(SpriteFrames.Array)->Texture[0].texnum +
                     (ulong)((uint)sprites.Array[uVar17].spriteframes * 0x50);
            uVar16 = 0;
            do {
              lVar14 = 0;
              do {
                lVar12 = (long)*(int *)(lVar22 + lVar14 * 4);
                if (0 < lVar12) {
                  *(TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_> **)
                   ((long)__s + lVar12 * 8) =
                       (TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_> *)
                       (puVar10 + uVar17 * 3 + 1);
                }
                lVar14 = lVar14 + 1;
              } while (lVar14 != 0x10);
              uVar16 = uVar16 + 1;
              lVar22 = lVar22 + 0x50;
            } while (uVar16 != bVar1);
          }
          bVar4 = 0 < (long)uVar17;
          uVar17 = uVar17 - 1;
        } while (bVar4);
      }
      if (Models.super_TArray<FModel_*,_FModel_*>.Count != 0) {
        uVar17 = 0;
        do {
          if (*(char *)((long)__s_00 + uVar17) == '\0') {
            pFVar2 = Models.super_TArray<FModel_*,_FModel_*>.Array[uVar17];
            pFVar3 = pFVar2->mVBuf;
            if (pFVar3 != (FModelVertexBuffer *)0x0) {
              (*(pFVar3->super_FVertexBuffer)._vptr_FVertexBuffer[1])();
            }
            pFVar2->mVBuf = (FModelVertexBuffer *)0x0;
          }
          uVar17 = uVar17 + 1;
        } while (uVar17 < Models.super_TArray<FModel_*,_FModel_*>.Count);
      }
      uVar20 = TexMan.Textures.Count;
      uVar9 = TexMan.Textures.Count - 1;
      if (0 < (int)TexMan.Textures.Count) {
        lVar22 = (ulong)uVar9 << 4;
        uVar17 = (ulong)uVar9;
        do {
          if (uVar17 < TexMan.Textures.Count) {
            lVar14 = *(long *)((long)&(TexMan.Textures.Array)->Texture + lVar22);
          }
          else {
            lVar14 = 0;
          }
          if (lVar14 != 0) {
            if ((texhitlist[uVar17] == '\0') &&
               (*(undefined8 **)(lVar14 + 0x48) != (undefined8 *)0x0)) {
              FGLTexture::Clean((FGLTexture *)**(undefined8 **)(lVar14 + 0x48),true);
            }
            pTVar19 = *(TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_> **)
                       ((long)__s + uVar17 * 8);
            if (((pTVar19 == (TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_> *)0x0) ||
                (hVar8 = TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_>::CountUsed(pTVar19),
                hVar8 == 0)) && (*(undefined8 **)(lVar14 + 0x50) != (undefined8 *)0x0)) {
              FGLTexture::Clean((FGLTexture *)**(undefined8 **)(lVar14 + 0x50),true);
            }
          }
          lVar22 = lVar22 + -0x10;
          bVar4 = 0 < (long)uVar17;
          uVar17 = uVar17 - 1;
        } while (bVar4);
      }
      if (gl_precache.Value != false) {
        local_64._0_4_ = I_FPSTime();
        local_64._4_4_ = CR_YELLOW;
        local_5c = false;
        pTVar19 = (TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_> *)0x1;
        clock_gettime(1,&local_40);
        lVar22 = CONCAT71(local_40.tv_sec._1_7_,(undefined1)local_40.tv_sec);
        dVar24 = (double)local_40.tv_nsec;
        if (0 < (int)uVar20) {
          lVar14 = (ulong)uVar9 << 4;
          uVar17 = (ulong)uVar9;
          do {
            if (uVar17 < TexMan.Textures.Count) {
              pFVar21 = *(FTexture **)((long)&(TexMan.Textures.Array)->Texture + lVar14);
            }
            else {
              pFVar21 = (FTexture *)0x0;
            }
            if (pFVar21 != (FTexture *)0x0) {
              PrecacheTexture((FGLInterface *)pTVar19,pFVar21,(uint)texhitlist[uVar17]);
              pTVar19 = *(TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_> **)
                         ((long)__s + uVar17 * 8);
              if ((pTVar19 != (TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_> *)0x0) &&
                 (hVar8 = TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_>::CountUsed(pTVar19)
                 , hVar8 != 0)) {
                translations = *(SpriteHits **)((long)__s + uVar17 * 8);
                pFVar13 = FMaterial::ValidateTexture(pFVar21,true);
                if (pFVar13 != (FMaterial *)0x0) {
                  FMaterial::PrecacheList(pFVar13,translations);
                }
                pTVar19 = (TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_> *)local_64;
                anon_unknown.dwarf_3307ce::PrecacheProgress::Update((PrecacheProgress *)local_64);
              }
            }
            lVar14 = lVar14 + -0x10;
            bVar4 = 0 < (long)uVar17;
            uVar17 = uVar17 - 1;
          } while (bVar4);
        }
        if (Models.super_TArray<FModel_*,_FModel_*>.Count != 0) {
          uVar17 = 0;
          do {
            if (*(char *)((long)__s_00 + uVar17) != '\0') {
              (*Models.super_TArray<FModel_*,_FModel_*>.Array[uVar17]->_vptr_FModel[5])();
              anon_unknown.dwarf_3307ce::PrecacheProgress::Update((PrecacheProgress *)local_64);
            }
            uVar17 = uVar17 + 1;
          } while (uVar17 < Models.super_TArray<FModel_*,_FModel_*>.Count);
        }
        clock_gettime(1,&local_40);
        DPrintf(3,"\x1cGTextures were precached in %.03f ms\n",
                (((double)local_40.tv_nsec - dVar24) * 1e-09 +
                ((double)CONCAT71(local_40.tv_sec._1_7_,(undefined1)local_40.tv_sec) -
                (double)lVar22)) * 1000.0);
      }
      operator_delete__(__s);
      puVar10 = local_50;
      lVar22 = *local_50 * 0x18;
      lVar14 = lVar22;
      uVar17 = *local_50;
      while (uVar17 != 0) {
        TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_>::~TMap
                  ((TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_> *)
                   ((long)puVar10 + lVar14 + -0x10));
        lVar14 = lVar14 + -0x18;
        uVar17 = lVar14;
      }
      operator_delete__(puVar10,lVar22 + 8);
      operator_delete__(__s_00);
      return;
    }
    ti = (PClassActor *)(pFVar18->Textures).Array;
    iVar7 = GLTranslationPalette::GetInternalTranslation
                      (*(int *)((ti->super_PClass).Defaults + 0x380));
    if (0 < ti->NumOwnedStates) {
      lVar22 = 0;
      local_48 = pFVar18;
      do {
        local_40.tv_sec._0_1_ = 1;
        TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_>::Insert
                  ((TMap<int,_bool,_THashTraits<int>,_TValueTraits<bool>_> *)
                   (puVar10 + (ulong)ti->OwnedStates[lVar22].sprite * 3 + 1),iVar7,(bool *)&local_40
                  );
        pFVar11 = gl_FindModelFrame((PClass *)ti,(uint)ti->OwnedStates[lVar22].sprite,
                                    (uint)ti->OwnedStates[lVar22].Frame,false);
        if (pFVar11 != (FSpriteModelFrame *)0x0) {
          lVar14 = 0;
          do {
            ppFVar6 = Models.super_TArray<FModel_*,_FModel_*>.Array;
            lVar12 = (long)pFVar11->skinIDs[lVar14].texnum;
            if (lVar12 < 1) {
              if ((long)pFVar11->modelIDs[lVar14] != -1) {
                pFVar2 = Models.super_TArray<FModel_*,_FModel_*>.Array[pFVar11->modelIDs[lVar14]];
                pFVar2->curSpriteMDLFrame = pFVar11;
                pFVar2->curMDLIndex = (int)lVar14;
                (*ppFVar6[pFVar11->modelIDs[lVar14]]->_vptr_FModel[6])();
              }
            }
            else {
              texhitlist[lVar12] = texhitlist[lVar12] | 2;
            }
            if ((long)pFVar11->modelIDs[lVar14] != -1) {
              *(undefined1 *)((long)__s_00 + (long)pFVar11->modelIDs[lVar14]) = 1;
            }
            lVar14 = lVar14 + 1;
          } while (lVar14 != 4);
        }
        lVar22 = lVar22 + 1;
        pFVar18 = local_48;
        pTVar23 = local_58;
      } while (lVar22 < ti->NumOwnedStates);
    }
  } while( true );
}

Assistant:

void FGLInterface::Precache(BYTE *texhitlist, TMap<PClassActor*, bool> &actorhitlist)
{
	SpriteHits *spritelist = new SpriteHits[sprites.Size()];
	SpriteHits **spritehitlist = new SpriteHits*[TexMan.NumTextures()];
	TMap<PClassActor*, bool>::Iterator it(actorhitlist);
	TMap<PClassActor*, bool>::Pair *pair;
	BYTE *modellist = new BYTE[Models.Size()];
	memset(modellist, 0, Models.Size());
	memset(spritehitlist, 0, sizeof(SpriteHits**) * TexMan.NumTextures());

	// this isn't done by the main code so it needs to be done here first:
	// check skybox textures and mark the separate faces as used
	for (int i = 0; i<TexMan.NumTextures(); i++)
	{
		// HIT_Wall must be checked for MBF-style sky transfers. 
		if (texhitlist[i] & (FTextureManager::HIT_Sky | FTextureManager::HIT_Wall))
		{
			FTexture *tex = TexMan.ByIndex(i);
			if (tex->gl_info.bSkybox)
			{
				FSkyBox *sb = static_cast<FSkyBox*>(tex);
				for (int i = 0; i<6; i++)
				{
					if (sb->faces[i])
					{
						int index = sb->faces[i]->id.GetIndex();
						texhitlist[index] |= FTextureManager::HIT_Flat;
					}
				}
			}
		}
	}

	// Check all used actors.
	// 1. mark all sprites associated with its states
	// 2. mark all model data and skins associated with its states
	while (it.NextPair(pair))
	{
		PClassActor *cls = pair->Key;
		int gltrans = GLTranslationPalette::GetInternalTranslation(GetDefaultByType(cls)->Translation);

		for (int i = 0; i < cls->NumOwnedStates; i++)
		{
			spritelist[cls->OwnedStates[i].sprite].Insert(gltrans, true);
			FSpriteModelFrame * smf = gl_FindModelFrame(cls, cls->OwnedStates[i].sprite, cls->OwnedStates[i].Frame, false);
			if (smf != NULL)
			{
				for (int i = 0; i < MAX_MODELS_PER_FRAME; i++)
				{
					if (smf->skinIDs[i].isValid())
					{
						texhitlist[smf->skinIDs[i].GetIndex()] |= FTexture::TEX_Flat;
					}
					else if (smf->modelIDs[i] != -1)
					{
						Models[smf->modelIDs[i]]->PushSpriteMDLFrame(smf, i);
						Models[smf->modelIDs[i]]->AddSkins(texhitlist);
					}
					if (smf->modelIDs[i] != -1)
					{
						modellist[smf->modelIDs[i]] = 1;
					}
				}
			}
		}
	}

	// mark all sprite textures belonging to the marked sprites.
	for (int i = (int)(sprites.Size() - 1); i >= 0; i--)
	{
		if (spritelist[i].CountUsed())
		{
			int j, k;
			for (j = 0; j < sprites[i].numframes; j++)
			{
				const spriteframe_t *frame = &SpriteFrames[sprites[i].spriteframes + j];

				for (k = 0; k < 16; k++)
				{
					FTextureID pic = frame->Texture[k];
					if (pic.isValid())
					{
						spritehitlist[pic.GetIndex()] = &spritelist[i];
					}
				}
			}
		}
	}

	// delete everything unused before creating any new resources to avoid memory usage peaks.

	// delete unused models
	for (unsigned i = 0; i < Models.Size(); i++)
	{
		if (!modellist[i]) Models[i]->DestroyVertexBuffer();
	}

	// delete unused textures
	int cnt = TexMan.NumTextures();
	for (int i = cnt - 1; i >= 0; i--)
	{
		FTexture *tex = TexMan.ByIndex(i);
		if (tex != nullptr)
		{
			if (!texhitlist[i])
			{
				if (tex->gl_info.Material[0]) tex->gl_info.Material[0]->Clean(true);
			}
			if (spritehitlist[i] == nullptr || (*spritehitlist[i]).CountUsed() == 0)
			{
				if (tex->gl_info.Material[1]) tex->gl_info.Material[1]->Clean(true);
			}
		}
	}

	if (gl_precache)
	{
		PrecacheProgress precacheProgress;

		// Consider to comment out PrecacheProgress::Update() call below
		// in order to get more precise timing results
		cycle_t precacheProfiler;
		precacheProfiler.Reset();
		precacheProfiler.Clock();

		// cache all used textures
		for (int i = cnt - 1; i >= 0; i--)
		{
			FTexture *tex = TexMan.ByIndex(i);
			if (tex != nullptr)
			{
				PrecacheTexture(tex, texhitlist[i]);
				if (spritehitlist[i] != nullptr && (*spritehitlist[i]).CountUsed() > 0)
				{
					PrecacheSprite(tex, *spritehitlist[i]);
					precacheProgress.Update();
				}
			}
		}

		// cache all used models
		for (unsigned i = 0; i < Models.Size(); i++)
		{
			if (modellist[i])
			{
				Models[i]->BuildVertexBuffer();
				precacheProgress.Update();
			}
		}

		precacheProfiler.Unclock();
		DPrintf(DMSG_NOTIFY, TEXTCOLOR_RED "Textures were precached in %.03f ms\n", precacheProfiler.TimeMS());
	}

	delete[] spritehitlist;
	delete[] spritelist;
	delete[] modellist;
}